

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall
GibbsSamplerFromHDP::writeParameters
          (GibbsSamplerFromHDP *this,string *thetaFilename,string *phiFilename)

{
  string local_70 [48];
  string local_40 [32];
  string *local_20;
  string *phiFilename_local;
  string *thetaFilename_local;
  GibbsSamplerFromHDP *this_local;
  
  local_20 = phiFilename;
  phiFilename_local = thetaFilename;
  thetaFilename_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)thetaFilename);
  outputVector<double>(&this->_thetaEx,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string(local_70,(string *)phiFilename);
  outputVector<double>(&this->_phiEx,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void GibbsSamplerFromHDP::writeParameters(string thetaFilename, string phiFilename)const{//{{{
    outputVector(_thetaEx, thetaFilename);
    outputVector(_phiEx, phiFilename);
}